

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PathIntegrator::SampleLd
          (PathIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler)

{
  Vector3f *pVVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  ulong uVar3;
  size_t sVar4;
  undefined1 auVar6 [16];
  short sVar7;
  ushort uVar8;
  undefined1 auVar9 [16];
  Vector3f wiRender;
  Point3fi *pPVar10;
  Point3fi *pPVar11;
  undefined8 uVar12;
  undefined8 this_00;
  bool bVar13;
  BxDFFlags BVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  DebugMLTSampler *this_01;
  Tuple3<pbrt::Vector3,_float> *w;
  PowerLightSampler *this_02;
  undefined1 auVar18 [16];
  Float FVar19;
  float fVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar33 [64];
  undefined8 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [56];
  undefined1 auVar41 [16];
  undefined1 in_ZMM3 [64];
  Point3f PVar42;
  Vector3f woRender;
  Vector3f wiRender_00;
  SampledSpectrum SVar43;
  optional<pbrt::SampledLight> sampledLight;
  Float f_1;
  optional<pbrt::LightLiSample> ls;
  SampledSpectrum f;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  float local_1bc;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  SampledWavelengths *local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  Interval IStack_188;
  Tuple3<pbrt::Normal3,_float> TStack_180;
  float local_174;
  float fStack_170;
  float local_16c;
  undefined1 local_168 [16];
  undefined4 local_14c;
  Tuple3<pbrt::Vector3,_float> local_148;
  float fStack_13c;
  undefined8 local_138;
  float local_130;
  float local_12c;
  Interaction local_128;
  char local_d8;
  Interval local_c8;
  Interval IStack_c0;
  Interval IStack_b8;
  undefined1 auStack_b0 [16];
  undefined8 uStack_a0;
  Interval *local_98;
  undefined8 *puStack_90;
  undefined8 *puStack_88;
  undefined4 *puStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  anon_struct_8_0_00000001_for___align local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar32 [64];
  undefined1 extraout_var [60];
  undefined1 auVar34 [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 auVar39 [64];
  
  local_168._8_8_ = local_168._0_8_;
  auVar41 = in_ZMM3._0_16_;
  IStack_188 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  pPVar10 = &(intr->super_Interaction).pi;
  pPVar11 = &(intr->super_Interaction).pi;
  local_198._0_4_ =
       (pPVar10->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  local_198._4_4_ =
       (pPVar10->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  local_198._8_4_ =
       (pPVar11->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  local_198._12_4_ =
       (pPVar11->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar34 = ZEXT856((ulong)(intr->super_Interaction).pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  TStack_180.x = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  TStack_180.y = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  TStack_180.z = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar2 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar5 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_16c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_1a8 = lambda;
  local_174 = (float)uVar2;
  fStack_170 = (float)uVar5;
  BVar14 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
           ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                       *)bsdf);
  if (((BVar14 & Reflection) == Unset) ||
     (BVar14 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
               ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                           *)bsdf), (BVar14 & Transmission) != Unset)) {
    BVar14 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
             ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                         *)bsdf);
    if (((BVar14 & Transmission) != Unset) &&
       (BVar14 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                 ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                             *)bsdf), (BVar14 & Reflection) == Unset)) {
      uVar3._0_4_ = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar3._4_4_ = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar18._0_8_ = uVar3 ^ 0x8000000080000000;
      auVar18._8_4_ = 0x80000000;
      auVar18._12_4_ = 0x80000000;
      auVar34 = ZEXT856(auVar18._8_8_);
      local_148.z = -(intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      w = &local_148;
      local_148._0_8_ = vmovlps_avx(auVar18);
      goto LAB_003f49f6;
    }
  }
  else {
    w = &(intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>;
LAB_003f49f6:
    PVar42 = Interaction::OffsetRayOrigin(&intr->super_Interaction,(Vector3f *)w);
    auVar36._0_4_ = PVar42.super_Tuple3<pbrt::Point3,_float>.z;
    auVar23._0_8_ = PVar42.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar23._8_56_ = auVar34;
    auVar36._4_4_ = auVar36._0_4_;
    auVar36._8_4_ = auVar36._0_4_;
    auVar36._12_4_ = auVar36._0_4_;
    local_198 = vshufps_avx(auVar23._0_16_,auVar23._0_16_,0x50);
    IStack_188 = (Interval)vmovlps_avx(auVar36);
  }
  local_148._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar19 = DispatchSplit<9>::operator()
                     ((DispatchSplit<9> *)&local_c8,&local_148,(ulong)local_148._0_8_ >> 0x30);
  local_168._0_8_ = this;
  uVar3 = (this->lightSampler).
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          .bits;
  sVar7 = (short)(uVar3 >> 0x30);
  if (uVar3 >> 0x30 < 3) {
    this_02 = (PowerLightSampler *)(uVar3 & 0xffffffffffff);
    if (sVar7 == 2) {
      PowerLightSampler::Sample((optional<pbrt::SampledLight> *)local_1d8,this_02,FVar19);
    }
    else {
      sVar4 = (this_02->lights).nStored;
      if (sVar4 == 0) {
        local_1d8._0_12_ = ZEXT412(0);
        local_1d8._12_4_ = 0;
        local_1c8._0_1_ = false;
        local_1c8._1_7_ = 0;
      }
      else {
        auVar41 = vcvtusi2ss_avx512f(auVar41,sVar4);
        iVar16 = (int)(FVar19 * auVar41._0_4_);
        iVar15 = (int)sVar4 + -1;
        if (iVar16 <= iVar15) {
          iVar15 = iVar16;
        }
        local_1c8._0_1_ = true;
        local_1d8._8_4_ = 1.0 / auVar41._0_4_;
        local_1d8._0_8_ =
             (this_02->lights).ptr[iVar15].
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
      }
    }
  }
  else if (sVar7 == 3) {
    BVHLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1d8,(BVHLightSampler *)(uVar3 & 0xffffffffffff)
               ,(LightSampleContext *)local_198,FVar19);
  }
  else {
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1d8,
               (ExhaustiveLightSampler *)(uVar3 & 0xffffffffffff),(LightSampleContext *)local_198,
               FVar19);
  }
  uVar3 = (sampler->
          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  this_01 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
  uVar8 = (ushort)(uVar3 >> 0x30);
  if (uVar3 >> 0x30 < 5) {
    if (uVar3 < 0x3000000000000) {
      if (uVar8 == 2) {
        auVar24._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_01);
        auVar24._8_56_ = extraout_var_00;
        auVar41 = auVar24._0_16_;
      }
      else {
        auVar28._0_8_ = RandomSampler::Get2D((RandomSampler *)this_01);
        auVar28._8_56_ = extraout_var_04;
        auVar41 = auVar28._0_16_;
      }
    }
    else if (uVar8 == 3) {
      auVar26._0_8_ = HaltonSampler::Get2D((HaltonSampler *)this_01);
      auVar26._8_56_ = extraout_var_02;
      auVar41 = auVar26._0_16_;
    }
    else {
      auVar30._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_01);
      auVar30._8_56_ = extraout_var_06;
      auVar41 = auVar30._0_16_;
    }
  }
  else if (uVar8 < 7) {
    if (uVar8 == 6) {
      auVar25._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)this_01);
      auVar25._8_56_ = extraout_var_01;
      auVar41 = auVar25._0_16_;
    }
    else {
      auVar29._0_8_ = SobolSampler::Get2D((SobolSampler *)this_01);
      auVar29._8_56_ = extraout_var_05;
      auVar41 = auVar29._0_16_;
    }
  }
  else if (uVar3 >> 0x30 == 8) {
    auVar31._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
    auVar31._8_56_ = extraout_var_07;
    auVar41 = auVar31._0_16_;
  }
  else if (uVar8 == 7) {
    auVar27._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_01);
    auVar27._8_56_ = extraout_var_03;
    auVar41 = auVar27._0_16_;
  }
  else {
    local_1b8 = DebugMLTSampler::Get1D(this_01);
    uStack_1b4 = extraout_XMM0_Db;
    uStack_1b0 = extraout_XMM0_Dc;
    uStack_1ac = extraout_XMM0_Dd;
    auVar33._0_4_ = DebugMLTSampler::Get1D(this_01);
    auVar33._4_60_ = extraout_var;
    auVar41._4_4_ = uStack_1b4;
    auVar41._0_4_ = local_1b8;
    auVar41._8_4_ = uStack_1b0;
    auVar41._12_4_ = uStack_1ac;
    auVar41 = vinsertps_avx(auVar41,auVar33._0_16_,0x10);
  }
  auVar18 = local_198;
  uVar21 = 0;
  uVar35 = 0;
  if (local_1c8._0_1_ == false) goto LAB_003f4e42;
  uVar12 = local_1d8._0_8_;
  auStack_b0._8_8_ = CONCAT44(local_174,TStack_180.z);
  uStack_a0 = CONCAT44(local_16c,fStack_170);
  local_c8.low = (Float)local_198._0_4_;
  local_c8.high = (Float)local_198._4_4_;
  IStack_c0.low = (Float)local_198._8_4_;
  IStack_c0.high = (Float)local_198._12_4_;
  IStack_b8 = IStack_188;
  auStack_b0._0_4_ = TStack_180.x;
  auStack_b0._4_4_ = TStack_180.y;
  local_58 = *(undefined8 *)(local_1a8->lambda).values;
  uStack_50 = *(undefined8 *)((local_1a8->lambda).values + 2);
  uStack_48 = *(undefined8 *)(local_1a8->pdf).values;
  uStack_40 = *(undefined8 *)((local_1a8->pdf).values + 2);
  puStack_88 = &local_58;
  puStack_90 = &local_68;
  local_68 = vmovlps_avx(auVar41);
  puStack_80 = &local_14c;
  local_14c = 0;
  local_60 = (anon_struct_8_0_00000001_for___align)local_1d8._0_8_;
  local_198 = auVar18;
  local_98 = &local_c8;
  DispatchSplit<9>::operator()(&local_148);
  uVar21 = 0;
  if (local_d8 == '\x01') {
    this_00 = local_168._0_8_;
    if ((local_148.x == 0.0) && (!NAN(local_148.x))) {
      uVar3 = 0;
      while (uVar17 = uVar3, uVar17 != 3) {
        if (((&local_148.y)[uVar17] != 0.0) || (uVar3 = uVar17 + 1, NAN((&local_148.y)[uVar17])))
        break;
      }
      if (2 < uVar17) goto LAB_003f4e2c;
    }
    uVar35 = 0;
    if ((local_12c != 0.0) || (NAN(local_12c))) {
      pVVar1 = &(intr->super_Interaction).wo;
      local_78._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
      local_78._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
      local_1bc = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_130;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
      uStack_70 = 0;
      local_1a8 = (SampledWavelengths *)local_138;
      uStack_1a0 = 0;
      local_1b8 = local_130;
      auVar40 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar34 = ZEXT856(0);
      SVar43 = BSDF::f(bsdf,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,Radiance);
      auVar39._0_8_ = SVar43.values.values._8_8_;
      auVar39._8_56_ = auVar40;
      auVar32._0_8_ = SVar43.values.values._0_8_;
      auVar32._8_56_ = auVar34;
      fVar20 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar41 = vmovlhps_avx(auVar32._0_16_,auVar39._0_16_);
      auVar9._8_8_ = uStack_1a0;
      auVar9._0_8_ = local_1a8;
      auVar18 = vmovshdup_avx(auVar9);
      auVar36 = ZEXT416((uint)(local_1b8 * fVar20));
      auVar18 = vfmadd132ss_fma(auVar18,auVar36,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y
                                       ));
      auVar36 = vfmsub213ss_fma(ZEXT416((uint)fVar20),ZEXT416((uint)local_1b8),auVar36);
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ + auVar36._0_4_)),auVar9,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x
                                       ));
      auVar37._0_4_ = auVar18._0_4_;
      auVar37._4_4_ = auVar37._0_4_;
      auVar37._8_4_ = auVar37._0_4_;
      auVar37._12_4_ = auVar37._0_4_;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl(auVar37,auVar6);
      local_c8.low = auVar18._0_4_ * auVar41._0_4_;
      local_c8.high = auVar18._4_4_ * auVar41._4_4_;
      IStack_c0.low = auVar18._8_4_ * auVar41._8_4_;
      IStack_c0.high = auVar18._12_4_ * auVar41._12_4_;
      if ((local_c8.low == 0.0) && (!NAN(local_c8.low))) {
        uVar3 = 0;
        while (uVar17 = uVar3, uVar17 != 3) {
          if (((&local_c8.high)[uVar17] != 0.0) ||
             (uVar3 = uVar17 + 1, NAN((&local_c8.high)[uVar17]))) break;
        }
        uVar21 = 0;
        uVar35 = 0;
        if (2 < uVar17) goto LAB_003f4e42;
      }
      if (local_d8 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
      }
      bVar13 = Integrator::Unoccluded((Integrator *)this_00,&intr->super_Interaction,&local_128);
      uVar21 = 0;
      uVar35 = 0;
      if (bVar13) {
        if ((local_1c8._0_1_ != true) || (local_d8 == '\0')) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
        }
        local_12c = (float)local_1d8._8_4_ * local_12c;
        if (*(uint *)(uVar12 & 0xffffffffffff) < 2) {
          auVar22._0_4_ = local_148.x * local_c8.low;
          auVar22._4_4_ = local_148.y * local_c8.high;
          auVar22._8_4_ = local_148.z * IStack_c0.low;
          auVar22._12_4_ = fStack_13c * IStack_c0.high;
          auVar38._4_4_ = local_12c;
          auVar38._0_4_ = local_12c;
          auVar38._8_4_ = local_12c;
          auVar38._12_4_ = local_12c;
        }
        else {
          local_168 = ZEXT416((uint)local_12c);
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_1bc;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_78;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_78._4_4_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_1b8;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_1a8;
          FVar19 = BSDF::PDF(bsdf,woRender,wiRender_00,Radiance,All);
          if (local_d8 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
          }
          fVar20 = ((float)local_168._0_4_ * (float)local_168._0_4_) /
                   ((float)local_168._0_4_ * (float)local_168._0_4_ + FVar19 * FVar19);
          auVar22._0_4_ = fVar20 * local_148.x * local_c8.low;
          auVar22._4_4_ = fVar20 * local_148.y * local_c8.high;
          auVar22._8_4_ = fVar20 * local_148.z * IStack_c0.low;
          auVar22._12_4_ = fVar20 * fStack_13c * IStack_c0.high;
          auVar38._4_4_ = local_168._0_4_;
          auVar38._0_4_ = local_168._0_4_;
          auVar38._8_4_ = local_168._0_4_;
          auVar38._12_4_ = local_168._0_4_;
        }
        auVar41 = vdivps_avx(auVar22,auVar38);
        uVar21 = auVar41._0_8_;
        auVar41 = vshufpd_avx(auVar41,auVar41,1);
        uVar35 = auVar41._0_8_;
      }
    }
  }
  else {
LAB_003f4e2c:
    uVar35 = 0;
  }
LAB_003f4e42:
  SVar43.values.values[2] = (float)(int)uVar35;
  SVar43.values.values[3] = (float)(int)((ulong)uVar35 >> 0x20);
  SVar43.values.values[0] = (float)(int)uVar21;
  SVar43.values.values[1] = (float)(int)((ulong)uVar21 >> 0x20);
  return (SampledSpectrum)SVar43.values.values;
}

Assistant:

SampledSpectrum PathIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF *bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler) const {
    // Initialize _LightSampleContext_ for light sampling
    LightSampleContext ctx(intr);
    // Try to nudge the light sampling position to correct side of the surface
    if (bsdf->HasReflection() && !bsdf->HasTransmission())
        ctx.pi = intr.OffsetRayOrigin(intr.wo);
    else if (bsdf->HasTransmission() && !bsdf->HasReflection())
        ctx.pi = intr.OffsetRayOrigin(-intr.wo);

    // Choose a light source for the direct lighting calculation
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(ctx, sampler.Get1D());
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};

    // Sample a point on the light source for direct lighting
    LightHandle light = sampledLight->light;
    DCHECK(light != nullptr && sampledLight->pdf > 0);
    pstd::optional<LightLiSample> ls =
        light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls->L || ls->pdf == 0)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls->wi;
    SampledSpectrum f = bsdf->f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls->pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float lightPDF = sampledLight->pdf * ls->pdf;
    if (IsDeltaLight(light.Type()))
        return f * ls->L / lightPDF;
    else {
        Float bsdfPDF = bsdf->PDF(wo, wi);
        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
        return f * ls->L * weight / lightPDF;
    }
}